

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::PrintSmartPointer<unsigned_char,std::shared_ptr<unsigned_char>,void>
               (shared_ptr<unsigned_char> *ptr,ostream *os,int param_3)

{
  bool bVar1;
  ostream *poVar2;
  element_type *p;
  void *pvVar3;
  element_type_conflict *value;
  int param_2_local;
  ostream *os_local;
  shared_ptr<unsigned_char> *ptr_local;
  
  bVar1 = std::operator==(ptr,(nullptr_t)0x0);
  if (bVar1) {
    std::operator<<(os,"(nullptr)");
  }
  else {
    poVar2 = std::operator<<(os,"(ptr = ");
    p = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                  (&ptr->super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>);
    pvVar3 = VoidifyPointer(p);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar3);
    std::operator<<(poVar2,", value = ");
    value = std::__shared_ptr_access<unsigned_char,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator*((__shared_ptr_access<unsigned_char,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)ptr);
    UniversalPrinter<unsigned_char>::Print(value,os);
    std::operator<<(os,")");
  }
  return;
}

Assistant:

void PrintSmartPointer(const Ptr& ptr, std::ostream* os, int) {
  if (ptr == nullptr) {
    *os << "(nullptr)";
  } else {
    *os << "(ptr = " << (VoidifyPointer)(ptr.get()) << ", value = ";
    UniversalPrinter<T>::Print(*ptr, os);
    *os << ")";
  }
}